

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void write_audio_frame(Emulator *e,u32 gb_frames)

{
  byte bVar1;
  u8 *puVar2;
  int local_2c;
  u32 accumulator;
  AudioBuffer *buffer;
  int local_18;
  int j;
  int i;
  u32 gb_frames_local;
  Emulator *e_local;
  
  (e->audio_buffer).divisor = gb_frames + (e->audio_buffer).divisor;
  (e->audio_buffer).freq_counter =
       (e->audio_buffer).frequency * gb_frames + (e->audio_buffer).freq_counter;
  if (0x1fffff < (e->audio_buffer).freq_counter) {
    (e->audio_buffer).freq_counter = (e->audio_buffer).freq_counter - 0x200000;
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      local_2c = 0;
      for (buffer._4_4_ = 0; buffer._4_4_ < 4; buffer._4_4_ = buffer._4_4_ + 1) {
        if ((e->config).disable_sound[buffer._4_4_] == FALSE) {
          local_2c = (e->state).apu.channel[buffer._4_4_].accumulator *
                     (e->state).apu.so_output[buffer._4_4_][local_18] + local_2c;
        }
      }
      bVar1 = (e->state).apu.so_volume[local_18];
      puVar2 = (e->audio_buffer).position;
      (e->audio_buffer).position = puVar2 + 1;
      *puVar2 = (u8)(((bVar1 + 1) * 0x10 * local_2c >> 5) / (e->audio_buffer).divisor);
    }
    for (buffer._4_4_ = 0; buffer._4_4_ < 4; buffer._4_4_ = buffer._4_4_ + 1) {
      (e->state).apu.channel[buffer._4_4_].accumulator = 0;
    }
    (e->audio_buffer).divisor = 0;
  }
  if ((e->audio_buffer).position <= (e->audio_buffer).end) {
    return;
  }
  __assert_fail("buffer->position <= buffer->end",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                0xf36,"void write_audio_frame(Emulator *, u32)");
}

Assistant:

static void write_audio_frame(Emulator* e, u32 gb_frames) {
  int i, j;
  AudioBuffer* buffer = &e->audio_buffer;
  buffer->divisor += gb_frames;
  buffer->freq_counter += buffer->frequency * gb_frames;
  if (VALUE_WRAPPED(buffer->freq_counter, APU_TICKS_PER_SECOND)) {
    for (i = 0; i < SOUND_OUTPUT_COUNT; ++i) {
      u32 accumulator = 0;
      for (j = 0; j < APU_CHANNEL_COUNT; ++j) {
        if (!e->config.disable_sound[j]) {
          accumulator += APU.channel[j].accumulator * APU.so_output[j][i];
        }
      }
      accumulator *= (APU.so_volume[i] + 1) * 16; /* 4bit -> 8bit samples. */
      accumulator /= ((SOUND_OUTPUT_MAX_VOLUME + 1) * APU_CHANNEL_COUNT);
      *buffer->position++ = accumulator / buffer->divisor;
    }
    for (j = 0; j < APU_CHANNEL_COUNT; ++j) {
      APU.channel[j].accumulator = 0;
    }
    buffer->divisor = 0;
  }
  assert(buffer->position <= buffer->end);
}